

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

double __thiscall icu_63::CalendarAstronomer::getMoonAge(CalendarAstronomer *this)

{
  double dVar1;
  double dVar2;
  
  getMoonPosition(this);
  dVar1 = this->moonEclipLong - this->sunLongitude;
  dVar2 = uprv_floor_63(dVar1 / 6.283185307179586);
  return dVar2 * -6.283185307179586 + dVar1;
}

Assistant:

double CalendarAstronomer::getMoonAge() {
    // See page 147 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.
    //
    // Force the moon's position to be calculated.  We're going to use
    // some the intermediate results cached during that calculation.
    //
    getMoonPosition();

    return norm2PI(moonEclipLong - sunLongitude);
}